

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiTabItem * ImGui::TabBarFindTabByID(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  int i;
  
  if (tab_id != 0) {
    for (i = 0; i < (tab_bar->Tabs).Size; i = i + 1) {
      pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i);
      if (pIVar1->ID == tab_id) {
        pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i);
        return pIVar1;
      }
    }
  }
  return (ImGuiTabItem *)0x0;
}

Assistant:

ImGuiTabItem* ImGui::TabBarFindTabByID(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (tab_id != 0)
        for (int n = 0; n < tab_bar->Tabs.Size; n++)
            if (tab_bar->Tabs[n].ID == tab_id)
                return &tab_bar->Tabs[n];
    return NULL;
}